

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O0

array<char,_22UL> * libtorrent::aux::to_string(array<char,_22UL> *__return_storage_ptr__,int64_t n)

{
  undefined1 auVar1 [16];
  uint64_t uVar2;
  reference pvVar3;
  unsigned_long uVar4;
  pointer __dest;
  ulong local_38;
  ulong local_20;
  uint64_t un;
  char *p;
  int64_t n_local;
  
  pvVar3 = std::array<char,_22UL>::back(__return_storage_ptr__);
  *pvVar3 = '\0';
  local_38 = n;
  if (n < 0) {
    uVar4 = ::std::numeric_limits<unsigned_long>::max();
    local_38 = (uVar4 - n) + 1;
  }
  local_20 = local_38;
  do {
    un = (uint64_t)pvVar3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_20;
    *(char *)(un - 1) = SUB161(auVar1 % ZEXT816(10),0) + '0';
    local_20 = local_20 / 10;
    pvVar3 = (reference)(un - 1);
  } while (local_20 != 0);
  uVar2 = un - 1;
  if (n < 0) {
    *(undefined1 *)(un - 2) = 0x2d;
    uVar2 = un - 2;
  }
  un = uVar2;
  __dest = ::std::array<char,_22UL>::data((array<char,_22UL> *)__return_storage_ptr__);
  pvVar3 = std::array<char,_22UL>::back(__return_storage_ptr__);
  memmove(__dest,(void *)un,(size_t)(pvVar3 + (1 - un)));
  return __return_storage_ptr__;
}

Assistant:

std::array<char, 4 + std::numeric_limits<std::int64_t>::digits10>
		to_string(std::int64_t const n)
	{
		std::array<char, 4 + std::numeric_limits<std::int64_t>::digits10> ret;
		char *p = &ret.back();
		*p = '\0';
		// we want "un" to be the absolute value
		// since the absolute of INT64_MIN cannot be represented by a signed
		// int64, we calculate the abs in unsigned space
		std::uint64_t un = n < 0
			? std::numeric_limits<std::uint64_t>::max() - std::uint64_t(n) + 1
			: std::uint64_t(n);
		do {
			*--p = char('0' + un % 10);
			un /= 10;
		} while (un);
		if (n < 0) *--p = '-';
		std::memmove(ret.data(), p, std::size_t(&ret.back() - p + 1));
		return ret;
	}